

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ssize_t __thiscall Parser::write(Parser *this,int __fd,void *__buf,size_t __n)

{
  QTextStream *pQVar1;
  QString *m;
  QString *pQVar2;
  Point *string;
  undefined4 in_register_00000034;
  long lVar3;
  QString *prefix;
  Function *string_00;
  long in_FS_OFFSET;
  QTextStream out;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QTextStream local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&local_40,(QIODevice *)CONCAT44(in_register_00000034,__fd));
  if ((this->m_prefixes).d.size != 0) {
    local_58.d = (Data *)0x0;
    local_70.d = (Data *)0x0;
    local_70.ptr = (char16_t *)0x0;
    local_58.ptr = L"{\n";
    local_70.size = 0;
    local_58.size = 2;
    QTextStream::operator<<(&local_40,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    pQVar2 = (this->m_prefixes).d.ptr;
    for (lVar3 = (this->m_prefixes).d.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      pQVar1 = QTextStream::operator<<(&local_40,pQVar2);
      QTextStream::operator<<(pQVar1,"\n");
      pQVar2 = pQVar2 + 1;
    }
    local_58.d = (Data *)0x0;
    local_70.d = (Data *)0x0;
    local_70.ptr = (char16_t *)0x0;
    local_58.ptr = L"}\n";
    local_70.size = 0;
    local_58.size = 2;
    QTextStream::operator<<(&local_40,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  pQVar2 = (this->m_metadata).d.ptr;
  for (lVar3 = (this->m_metadata).d.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    pQVar1 = QTextStream::operator<<(&local_40,pQVar2);
    QTextStream::operator<<(pQVar1,"\n");
    pQVar2 = pQVar2 + 1;
  }
  string_00 = (this->m_functions).d.ptr;
  for (lVar3 = (this->m_functions).d.size * 0x48; lVar3 != 0; lVar3 = lVar3 + -0x48) {
    pQVar1 = QTextStream::operator<<(&local_40,&string_00->className);
    pQVar1 = QTextStream::operator<<(pQVar1,"_");
    pQVar1 = QTextStream::operator<<(pQVar1,&string_00->functionName);
    pQVar1 = QTextStream::operator<<(pQVar1,"_entry(");
    pQVar1 = QTextStream::operator<<(pQVar1,&string_00->functionParameters);
    QTextStream::operator<<(pQVar1,")\n");
    pQVar1 = QTextStream::operator<<(&local_40,&string_00->className);
    pQVar1 = QTextStream::operator<<(pQVar1,"_");
    pQVar1 = QTextStream::operator<<(pQVar1,&string_00->functionName);
    QTextStream::operator<<(pQVar1,"_exit()\n");
    string_00 = string_00 + 1;
  }
  string = (this->m_points).d.ptr;
  for (lVar3 = (this->m_points).d.size * 0x30; lVar3 != 0; lVar3 = lVar3 + -0x30) {
    pQVar1 = QTextStream::operator<<(&local_40,&string->name);
    pQVar1 = QTextStream::operator<<(pQVar1,"(");
    pQVar1 = QTextStream::operator<<(pQVar1,&string->parameters);
    QTextStream::operator<<(pQVar1,")\n");
    string = string + 1;
  }
  QTextStream::~QTextStream(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void Parser::write(QIODevice &input) const
{
    QTextStream out(&input);
    if (m_prefixes.size() > 0) {
        out << QStringLiteral("{\n");
        for (const auto &prefix : m_prefixes)
            out << prefix << "\n";
        out << QStringLiteral("}\n");
    }
    for (const auto &m : m_metadata)
        out << m << "\n";
    for (const auto &func : m_functions) {
        out << func.className << "_" << func.functionName << "_entry(" << func.functionParameters << ")\n";
        out << func.className << "_" << func.functionName << "_exit()\n";
    }
    for (const auto &point : m_points)
        out << point.name << "(" << point.parameters << ")\n";
}